

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::OutputWorker::Flush(OutputWorker *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> locker;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  atomic<bool> *in_stack_ffffffffffffffe8;
  
  std::unique_lock<std::mutex>::unique_lock
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffe8);
  if (!bVar1) {
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffdf);
    std::condition_variable::notify_all();
    std::condition_variable::wait((unique_lock *)&in_RDI[0xb]._M_owns);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void OutputWorker::Flush()
{
    // unique_lock used since FlushCondition.wait requires it
    std::unique_lock<std::mutex> locker(QueueLock);

    if (!Terminated)
    {
        FlushRequested = true;
        QueueCondition.notify_all();

        FlushCondition.wait(locker);
    }
}